

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

param * __thiscall mjs::activation_object::find(activation_object *this,wstring_view *s)

{
  gc_heap *h;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __y;
  bool bVar1;
  uint32_t uVar2;
  gc_vector<mjs::activation_object::param> *pgVar3;
  gc_table *pgVar4;
  gc_string *pgVar5;
  param *ppVar6;
  long lVar7;
  param *ppVar8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __x;
  gc_vector<mjs::activation_object::param> ps;
  gc_vector<mjs::activation_object::param> local_38;
  
  if ((this->params_).pos_ == 0) {
LAB_0011dafb:
    ppVar8 = (param *)0x0;
  }
  else {
    h = (this->super_object).heap_;
    pgVar3 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::activation_object::param>,_true>::dereference
                       (&this->params_,h);
    local_38.heap_ = pgVar3->heap_;
    local_38.table_.pos_ = (pgVar3->table_).pos_;
    local_38._12_4_ = *(undefined4 *)&pgVar3->field_0xc;
    pgVar4 = gc_vector<mjs::activation_object::param>::tab(&local_38);
    uVar2 = gc_vector<mjs::activation_object::param>::length(&local_38);
    lVar7 = (ulong)uVar2 + 1;
    ppVar6 = (param *)(&pgVar4[1].heap_ + uVar2);
    do {
      lVar7 = lVar7 + -1;
      if (lVar7 == 0) goto LAB_0011dafb;
      ppVar8 = ppVar6 + -1;
      pgVar5 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference(&ppVar6[-1].key,h);
      __x._M_len = (ulong)pgVar5->length_;
      __y._M_len = s->_M_len;
      __y._M_str = s->_M_str;
      __x._M_str = (wchar_t *)(pgVar5 + 1);
      bVar1 = std::operator==(__x,__y);
      ppVar6 = ppVar8;
    } while (!bVar1);
  }
  return ppVar8;
}

Assistant:

value operator()(const object_literal_expression& e) {
        auto o = global_->make_object();
        for (const auto& i : e.elements()) {
            const auto& name = i.name_str();
            const auto prev_attr = o->own_property_attributes(name);
            auto v = get_value(eval(i.value()));
            if (i.type() == property_assignment_type::normal) {
                o->put(string{heap_, name}, v);
            } else {
                // getter/setter
                assert(is_function(v));
                const bool is_get = i.type() == property_assignment_type::get;
                if (!is_valid(prev_attr) || !has_attributes(prev_attr, property_attribute::accessor)) {
                    // Define new property with get or set
                    o->define_accessor_property(string{heap_, name}, make_accessor_object(global_, is_get ? v : value::undefined, !is_get ? v : value::undefined), property_attribute::none);
                } else {
                    // Modifying existing property
                    o->modify_accessor_object(name, v, is_get);
                }
            }
        }
        return value{o};
    }